

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::Encode(idx2_file *Idx2,params *P,brick_copier *Copier)

{
  metadata *pmVar1;
  cstr __s;
  v3<int> *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 aVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  params *P_00;
  byte bVar10;
  long lVar11;
  u64 uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar16;
  anon_union_8_4_6ba14846_for_v2<int>_1 *Vol;
  char *pcVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  brick_volume *Val;
  long lVar25;
  long lVar26;
  anon_union_8_4_6ba14846_for_v2<int>_1 *paVar27;
  long *in_FS_OFFSET;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [64];
  undefined8 in_XMM2_Qb;
  extent eVar31;
  error<idx2::idx2_err_code> eVar32;
  v3i Brick3;
  extent BrickExtent;
  timer Timer;
  extent Skip;
  brick_traverse Second;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Encode_cpp:394:3)>
  __ScopeGuard__394;
  u64 BrickKey;
  extent BrickExtentCrop;
  encode_data E;
  brick_traverse Stack [128];
  u64 auStack_2738 [74];
  extent local_24e8;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_24d8;
  anon_union_8_4_6ba14846_for_v2<int>_1 aStack_24d0;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 aStack_24c8;
  undefined8 uStack_24c0;
  int local_24b8;
  int iStack_24b4;
  ulong uStack_24b0;
  int iStack_24a8;
  undefined4 uStack_24a4;
  undefined4 uStack_24a0;
  undefined4 uStack_249c;
  stack_array<idx2::v3<int>,_16> *local_2490;
  int local_2484;
  extent local_2480;
  idx2_file *local_2470;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2468;
  anon_union_8_4_6ba14846_for_v2<int>_1 aStack_2460;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 aStack_2458;
  undefined8 uStack_2450;
  undefined1 local_2448 [32];
  encode_data *local_2420;
  char local_2418;
  params *local_2410;
  brick_copier *local_2408;
  v3i *local_2400;
  ulong local_23f8;
  undefined1 local_23f0 [24];
  undefined1 local_23d8 [80];
  i64 local_2388;
  i64 local_2358;
  char local_2340;
  u64 auStack_2338 [17];
  anon_union_12_8_3dedac88_for_v3<int>_1 local_22b0 [51];
  undefined8 uStack_2048;
  undefined4 auStack_2040 [2];
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2038 [2];
  anon_union_8_4_6ba14846_for_v2<int>_1 aStack_2028;
  undefined8 uStack_2020;
  int aiStack_2018 [4];
  ulong auStack_2008 [2];
  anon_union_8_4_6ba14846_for_v2<int>_1 aaStack_1ff8 [3];
  ulong uStack_1fe0;
  undefined1 auStack_1fd8 [8104];
  
  auVar29 = in_ZMM1._0_16_;
  iVar23 = (Idx2->BrickDimsExt3).field_0.field_0.X;
  iVar15 = (Idx2->BrickDimsExt3).field_0.field_0.Y;
  iVar18 = (Idx2->BrickDimsExt3).field_0.field_0.Z;
  local_2408 = Copier;
  if (Mallocator()::Instance == '\0') {
    Encode();
  }
  free_list_allocator::free_list_allocator
            ((free_list_allocator *)&local_2038[0].field_0,(long)(iVar23 * iVar15 * iVar18 * 8),
             (allocator *)&Mallocator()::Instance);
  BrickAlloc_._28_4_ = uStack_2020._4_4_;
  BrickAlloc_._24_4_ = (undefined4)uStack_2020;
  BrickAlloc_._36_4_ = aiStack_2018[1];
  BrickAlloc_._32_4_ = aiStack_2018[0];
  BrickAlloc_._8_8_ = local_2038[1];
  BrickAlloc_._16_8_ = aStack_2028;
  auVar30 = ZEXT1664(auVar29);
  encode_data::encode_data((encode_data *)local_23d8);
  local_2418 = '\0';
  local_2420 = (encode_data *)local_23d8;
  Init((encode_data *)local_23d8,(allocator *)0x0);
  local_2400 = &Idx2->BrickDimsExt3;
  lVar11 = 0x38;
  do {
    *(undefined8 *)((long)&uStack_2048 + lVar11) = 0;
    *(undefined4 *)((long)auStack_2040 + lVar11) = 0;
    *(undefined8 *)((long)local_2038 + lVar11) = 0;
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0x2038);
  lVar11 = (long)local_2340;
  if (0xf < lVar11) {
LAB_0018c7db:
    pcVar17 = 
    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]";
LAB_0018c807:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,pcVar17);
  }
  local_2490 = &Idx2->NBricks3;
  pvVar2 = local_2490->Arr + lVar11;
  lVar19 = (long)(pvVar2->field_0).field_0.X;
  if (lVar19 == 0) {
    uStack_2020._4_4_ = 1;
  }
  else {
    uVar20 = lVar19 - 1;
    lVar19 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    uStack_2020._4_4_ = (uint)(1L << (-((byte)lVar19 ^ 0x3f) & 0x3f));
    if (uVar20 == 0) {
      uStack_2020._4_4_ = 1;
    }
  }
  lVar24 = (long)(pvVar2->field_0).field_0.Y;
  lVar19 = 0x100000000;
  if (lVar24 != 0) {
    uVar20 = lVar24 - 1;
    lVar24 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    if (uVar20 != 0) {
      lVar19 = 0x100000000 << (-((byte)lVar24 ^ 0x3f) & 0x3f);
    }
  }
  lVar24 = (long)(pvVar2->field_0).field_0.Z;
  if (lVar24 == 0) {
    aiStack_2018[1] = 1;
  }
  else {
    uVar20 = lVar24 - 1;
    lVar24 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    aiStack_2018[1] = 1;
    if (uVar20 != 0) {
      aiStack_2018[1] = (int)(1L << (-((byte)lVar24 ^ 0x3f) & 0x3f));
    }
  }
  local_2038[0] = *(anon_union_8_4_6ba14846_for_v2<int>_1 *)((Idx2->BricksOrder).Arr + lVar11);
  uStack_2020._4_4_ = (uint)lVar19 | uStack_2020._4_4_;
  local_2038[1] = local_2038[0];
  uVar20 = 0;
  aStack_2028 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  uStack_2020._0_4_ = 0;
  aiStack_2018[0] = (int)((ulong)lVar19 >> 0x20);
  aiStack_2018[2] = 0;
  aiStack_2018[3] = 0;
  auStack_2008[0]._0_4_ = 0;
  auStack_2008[1] = 0;
  local_2470 = Idx2;
  local_2410 = P;
  do {
    Vol = &local_24d8;
    lVar11 = uVar20 * 0x40;
    paVar27 = local_2038 + uVar20 * 8;
    aVar7 = paVar27->field_0;
    aVar16.field_0 = aVar7 >> 2;
    *paVar27 = aVar16;
    uVar22 = aVar7.X;
    if ((~uVar22 & 3) == 0) {
      if (aVar16 == (anon_union_8_4_6ba14846_for_v2<int>_1)0x3) {
        *paVar27 = local_2038[uVar20 * 8 + 1];
      }
      else {
        local_2038[uVar20 * 8 + 1] = aVar16;
      }
    }
    else {
      uVar14 = (uint)uVar20 - 1;
      if (((aiStack_2018[uVar20 * 0x10 + -1] - (&aStack_2028)[uVar20 * 8].field_0.X == 1) &&
          (aiStack_2018[uVar20 * 0x10] - *(int *)((long)&aStack_2028 + lVar11 + 4) == 1)) &&
         (aiStack_2018[uVar20 * 0x10 + 1] - *(int *)(&uStack_2020 + uVar20 * 8) == 1)) {
        auVar29 = auVar30._0_16_;
        clock_gettime(1,(timespec *)&local_2480);
        if (Mallocator()::Instance == '\0') {
          Encode();
        }
        auVar28 = SUB6416(ZEXT864(0),0) << 0x40;
        local_24d8 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
        aStack_24d0 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
        aStack_24c8 = (anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0)
                      &Mallocator()::Instance;
        uStack_24c0 = 0;
        local_24b8 = CONCAT31(local_24b8._1_3_,10);
        uStack_24b0 = 0;
        iStack_24a8 = 0;
        uStack_24a4 = 0;
        uStack_24a0 = 0;
        Resize((volume *)&Vol->field_0,local_2400,float64,(allocator *)local_23d8._0_8_);
        lVar24 = (long)(uStack_24c0 * 2) >> 0x2b;
        lVar19 = (long)(uStack_24c0 << 0x16) >> 0x2b;
        if (lVar19 != 0 && (lVar24 != 0 && (uStack_24c0 & 0x1fffff) != 0)) {
          memset((void *)local_24d8,0,lVar24 * lVar19 * ((long)(uStack_24c0 << 0x2b) >> 0x2b) * 8);
        }
        uVar22 = (Idx2->BrickDims3).field_0.field_0.X;
        uVar5 = (Idx2->BrickDims3).field_0.field_0.Y;
        uVar6 = (Idx2->BrickDims3).field_0.field_0.Z;
        local_24e8.From =
             (ulong)(*(int *)(&uStack_2020 + uVar20 * 8) * uVar6 & 0x1fffff) << 0x2a |
             (ulong)(*(int *)((long)&aStack_2028 + lVar11 + 4) * uVar5 & 0x1fffff) << 0x15 |
             (ulong)((&aStack_2028)[uVar20 * 8].field_0.X * uVar22 & 0x1fffff);
        local_24e8.Dims =
             (ulong)(uVar6 & 0x1fffff) << 0x2a |
             ((ulong)uVar5 & 0x1fffff) << 0x15 | (ulong)uVar22 & 0x1fffff;
        local_2468 = (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
        aStack_2460 = (anon_union_8_4_6ba14846_for_v2<int>_1)
                      ((ulong)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
                      ((ulong)(uint)(Idx2->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
                      (ulong)(uint)(Idx2->Dims3).field_0.field_0.X & 0x1fffff);
        local_23f0._8_16_ =
             (undefined1  [16])
             Crop<idx2::extent,idx2::extent>(&local_24e8,(extent *)&local_2468.field_0);
        Val = (brick_volume *)(ulong)(local_23f0._8_4_ - (int)local_24e8.From & 0x1fffff);
        uStack_24b0 = local_23f0._8_8_ - (local_24e8.From & 0x7ffffc0000000000) & 0x7ffffc0000000000
                      | (ulong)Val |
                      local_23f0._8_8_ * 0x800 + (local_24e8.From & 0x3ffffe00000) * -0x800 >> 0xb &
                      0x3ffffe00000;
        uVar21 = local_23f0._16_8_ & 0x7fffffffffffffff;
        iStack_24a8 = (int)uVar21;
        uStack_24a4 = (undefined4)(uVar21 >> 0x20);
        (**local_2408->_vptr_brick_copier)(local_2408,local_23f0 + 8,&uStack_24b0,Vol);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (Idx2->ValueRange).field_0.field_0.X;
        auVar28 = vminsd_avx(auVar28,auVar4);
        paVar27 = &aStack_2028 + uVar20 * 8;
        (Idx2->ValueRange).field_0.field_0.X = auVar28._0_8_;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (Idx2->ValueRange).field_0.field_0.Y;
        auVar29 = vmaxsd_avx(auVar29,auVar28);
        (Idx2->ValueRange).field_0.field_0.Y = auVar29._0_8_;
        local_2340 = '\0';
        local_22b0[0]._8_4_ = *(undefined4 *)(&uStack_2020 + uVar20 * 8);
        local_22b0[0]._0_8_ = paVar27->field_0;
        Brick3.field_0.field_0.Y = 0;
        Brick3.field_0.field_0.X = local_22b0[0]._8_4_;
        Brick3.field_0._8_4_ = SUB84(Val,0);
        uVar12 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)0x0,(int)local_22b0[0]._0_8_,Brick3);
        lVar11 = (long)local_2340;
        if (0xf < lVar11) {
          pcVar17 = 
          "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]"
          ;
          goto LAB_0018c807;
        }
        auStack_2338[lVar11] = uVar12;
        local_23f0._0_8_ = uVar12 * 0x10 + lVar11;
        Insert<unsigned_long,idx2::brick_volume>
                  ((iterator *)&local_2468.field_0,(idx2 *)(local_23d8 + 8),
                   (hash_table<unsigned_long,_idx2::brick_volume> *)local_23f0,
                   (unsigned_long *)Vol->E,Val);
        EncodeBrick(Idx2,(params *)local_23d8,(encode_data *)0x0,SUB81(Vol,0));
        clock_gettime(1,(timespec *)&local_2468.field_0);
        auVar30 = ZEXT1664(CONCAT88(in_XMM2_Qb,(double)(long)((long)aStack_2460 - local_2480.Dims)))
        ;
        in_XMM2_Qb = 0;
        TotalTime_ = (double)(long)((double)(long)((long)local_2468 - local_2480.From) *
                                    1000000000.0 +
                                   (double)(long)((long)aStack_2460 - local_2480.Dims)) /
                     1000000000.0 + TotalTime_;
        uVar20 = (ulong)uVar14;
      }
      else {
        local_24d8.field_0 =
             *(anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 *)paVar27;
        aStack_24d0 = local_2038[uVar20 * 8 + 1];
        aStack_24c8 = (&aStack_2028)[uVar20 * 8].field_0;
        uVar21 = (&uStack_2020)[uVar20 * 8];
        uStack_24b0 = auStack_2008[uVar20 * 8 + -1];
        local_24b8 = (int)*(undefined8 *)(aiStack_2018 + uVar20 * 0x10);
        iStack_24b4 = (int)((ulong)*(undefined8 *)(aiStack_2018 + uVar20 * 0x10) >> 0x20);
        iStack_24a8 = (int)auStack_2008[uVar20 * 8];
        uStack_24a4 = (undefined4)(auStack_2008[uVar20 * 8] >> 0x20);
        uStack_24a0 = (undefined4)auStack_2008[uVar20 * 8 + 1];
        uStack_249c = (undefined4)(auStack_2008[uVar20 * 8 + 1] >> 0x20);
        local_2468.field_0 =
             *(anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 *)paVar27;
        aStack_2460 = local_2038[uVar20 * 8 + 1];
        aStack_2458 = (&aStack_2028)[uVar20 * 8].field_0;
        uStack_2450 = (&uStack_2020)[uVar20 * 8];
        auVar3 = *(undefined1 (*) [32])(aiStack_2018 + uVar20 * 0x10);
        uVar13 = (ulong)((uVar22 & 3) << 2);
        iVar23 = *(int *)((long)&aStack_2028 + uVar13 + lVar11);
        iVar23 = (*(int *)((long)aiStack_2018 + uVar13 + lVar11 + -4) - iVar23) / 2 + iVar23;
        local_2448 = auVar3;
        *(int *)((long)&uStack_24c0 + uVar13 + 4) = iVar23;
        uVar8 = uStack_24b0;
        *(int *)((long)&aStack_2458.X + uVar13) = iVar23;
        uStack_24c0._4_4_ = (int)(uVar21 >> 0x20);
        local_23f8 = (ulong)aStack_24c8 & 0xffffffff;
        local_2484 = uStack_24c0._4_4_;
        uVar22 = uStack_24c0._4_4_ - aStack_24c8.X;
        lVar25 = (long)local_24b8;
        lVar19 = (long)aStack_24c8.Y;
        lVar26 = (long)iStack_24b4;
        uStack_24c0._0_4_ = (uint)uVar21;
        lVar24 = (long)(int)(uint)uStack_24c0;
        local_2480.From =
             (ulong)((uint)uStack_24c0 & 0x1fffff) << 0x2a |
             ((ulong)(uint)aStack_24c8.Y & 0x1fffff) << 0x15 | (ulong)aStack_24c8 & 0x1fffff;
        local_2480.Dims =
             (ulong)((uint)(lVar26 - lVar24) & 0x1fffff) << 0x2a |
             (ulong)((uint)(lVar25 - lVar19) & 0x1fffff) << 0x15 | (ulong)(uVar22 & 0x1fffff);
        lVar11 = (long)local_2340;
        uStack_24c0 = uVar21;
        if (0xf < lVar11) goto LAB_0018c7db;
        local_24e8.From = 0;
        local_24e8.Dims =
             (ulong)(local_2490->Arr[lVar11].field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)local_2490->Arr[lVar11].field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)local_2490->Arr[lVar11].field_0.field_0.X & 0x1fffff;
        auVar30 = ZEXT1664(auVar3._0_16_);
        eVar31 = Crop<idx2::extent,idx2::extent>(&local_2480,&local_24e8);
        iVar23 = iStack_24a8;
        uVar12 = eVar31.Dims;
        local_2448._8_8_ =
             ((long)(uVar12 << 0x16) >> 0x2b) * ((long)(uVar12 << 0x2b) >> 0x2b) *
             ((long)(uVar12 * 2) >> 0x2b) + uVar8;
        lVar11 = (long)local_2340;
        if (0xf < lVar11) goto LAB_0018c7db;
        local_24e8.From = 0;
        local_24e8.Dims =
             (ulong)(local_2490->Arr[lVar11].field_0.field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)local_2490->Arr[lVar11].field_0.field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)local_2490->Arr[lVar11].field_0.field_0.X & 0x1fffff;
        eVar31 = Crop<idx2::extent,idx2::extent>(&local_2480,&local_24e8);
        auVar3 = local_2448;
        local_2448._16_4_ =
             (((int)eVar31.Dims << 0xb) >> 0xb) * (int)((long)(eVar31.Dims * 2) >> 0x2b) *
             (int)((long)(eVar31.Dims << 0x16) >> 0x2b) + iVar23;
        uVar21 = auStack_2008[uVar20 * 8 + 1];
        uStack_24a0 = (undefined4)uVar21;
        uStack_249c = (undefined4)(uVar21 >> 0x20);
        local_2448._24_8_ = (lVar25 - lVar19) * (long)(int)uVar22 * (lVar26 - lVar24) + uVar21;
        auVar9 = local_2448;
        lVar11 = (long)local_2340;
        if (0xf < lVar11) goto LAB_0018c7db;
        iVar23 = (local_2490->Arr[lVar11].field_0.field_0.Z << 0xb) >> 0xb;
        iVar18 = (int)((long)((ulong)(uint)local_2490->Arr[lVar11].field_0.field_0.X << 0x2b) >>
                      0x2b);
        iVar15 = (int)((long)((ulong)(uint)local_2490->Arr[lVar11].field_0.field_0.Y << 0x2b) >>
                      0x2b);
        if ((((aStack_2458.X < iVar18) && (aStack_2458.Y < iVar15)) &&
            (((int)uStack_2450 < iVar23 &&
             ((0 < uStack_2450._4_4_ && (local_2448._0_4_ = auVar3._0_4_, 0 < (int)local_2448._0_4_)
              ))))) && (local_2448._4_4_ = auVar3._4_4_, 0 < (int)local_2448._4_4_)) {
          auVar30 = ZEXT3264(auVar9);
          *(undefined1 (*) [32])(aiStack_2018 + uVar20 * 0x10) = auVar9;
          *paVar27 = local_2468;
          local_2038[uVar20 * 8 + 1] = aStack_2460;
          (&aStack_2028)[uVar20 * 8].field_0 = aStack_2458;
          (&uStack_2020)[uVar20 * 8] = uStack_2450;
          uVar14 = (uint)uVar20;
        }
        if ((((((int)local_23f8 < iVar18) && (aStack_24c8.Y < iVar15)) &&
             ((int)(uint)uStack_24c0 < iVar23)) && ((0 < local_2484 && (0 < local_24b8)))) &&
           (0 < iStack_24b4)) {
          lVar11 = (long)(int)uVar14;
          uVar14 = uVar14 + 1;
          auVar3._4_4_ = iStack_24b4;
          auVar3._0_4_ = local_24b8;
          auVar3._8_8_ = uStack_24b0;
          auVar3._16_4_ = iStack_24a8;
          auVar3._20_4_ = uStack_24a4;
          auVar3._24_4_ = uStack_24a0;
          auVar3._28_4_ = uStack_249c;
          auVar30 = ZEXT3264(auVar3);
          *(undefined1 (*) [32])(auStack_1fd8 + lVar11 * 0x40) = auVar3;
          aaStack_1ff8[lVar11 * 8].field_0 =
               (anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0)local_24d8;
          aaStack_1ff8[lVar11 * 8 + 1] = aStack_24d0;
          aaStack_1ff8[lVar11 * 8 + 2].field_0 = aStack_24c8;
          *(ulong *)(auStack_1fd8 + lVar11 * 0x40 + -8) = uStack_24c0;
        }
        uVar20 = (ulong)uVar14;
        Idx2 = local_2470;
        local_2448 = auVar9;
      }
    }
    uVar22 = (uint)uVar20;
    if ((int)uVar22 < 0) {
      clock_gettime(1,(timespec *)&local_24d8.field_0);
      eVar32 = FlushChunks(Idx2,(encode_data *)local_23d8);
      if (eVar32.Code != NoError) {
        if ('?' < eVar32.StackIdx) {
          __assert_fail("false && \"stack too deep\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
                        ,0x1af,
                        "auto idx2::Encode(idx2_file *, const params &, brick_copier &)::(anonymous class)::operator()() const"
                       );
        }
        bVar10 = eVar32.StackIdx + 1;
        uVar22 = eVar32._8_4_ & 0xff00ff | (uint)bVar10 << 8;
        *(undefined4 *)(*in_FS_OFFSET + -0x980 + (long)(char)bVar10 * 4) = 0x1af;
        *(char **)(*in_FS_OFFSET + -0xb80 + (long)(char)bVar10 * 8) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
        ;
        paVar27 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)eVar32.Msg;
      }
      if (eVar32.Code == NoError) {
        eVar32 = FlushChunkExponents(Idx2,(encode_data *)local_23d8);
        if (eVar32.Code != NoError) {
          if ('?' < eVar32.StackIdx) {
            __assert_fail("false && \"stack too deep\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
                          ,0x1b0,
                          "auto idx2::Encode(idx2_file *, const params &, brick_copier &)::(anonymous class)::operator()() const"
                         );
          }
          bVar10 = eVar32.StackIdx + 1;
          uVar22 = eVar32._8_4_ & 0xff00ff | (uint)bVar10 << 8;
          *(undefined4 *)(*in_FS_OFFSET + -0x980 + (long)(char)bVar10 * 4) = 0x1b0;
          *(char **)(*in_FS_OFFSET + -0xb80 + (long)(char)bVar10 * 8) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
          ;
          paVar27 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)eVar32.Msg;
        }
        if (eVar32.Code == NoError) {
          clock_gettime(1,(timespec *)&local_2038[0].field_0);
          P_00 = local_2410;
          TotalTime_ = (double)(long)((double)((long)local_2038[0] - (long)local_24d8) *
                                      1000000000.0 +
                                     (double)((long)local_2038[1] - (long)aStack_24d0)) /
                       1000000000.0 + TotalTime_;
          __s = (cstr)(*in_FS_OFFSET + -0xf80);
          pmVar1 = &local_2410->Meta;
          pcVar17 = (local_2410->Meta).Field;
          snprintf(__s,0x400,"%s/%s/%s.idx2",local_2410->OutDir,pmVar1,pcVar17);
          WriteMetaFile(local_2470,P_00,__s);
          uVar22 = 0;
          printf("num channels            = %li\n",local_2388);
          printf("num sub channels        = %li\n",local_2358);
          snprintf(__s,0x400,"%s/%s/%s.idx2",P_00->OutDir,pmVar1,pcVar17);
          PrintStats(__s);
          printf("total time              = %f seconds\n",TotalTime_);
          *(char **)(*in_FS_OFFSET + -0xb80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Encode.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1bb;
          paVar27 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)0x1bd71d;
        }
      }
      if (local_2418 == '\0') {
        Dealloc(local_2420);
      }
      uVar22 = uVar22 & 0xffffff;
      eVar32.Code = (char)uVar22;
      eVar32.StackIdx = (char)(uVar22 >> 8);
      eVar32.StrGened = (bool)(char)(uVar22 >> 0x10);
      eVar32._11_1_ = (char)(uVar22 >> 0x18);
      eVar32.Msg = (cstr)paVar27;
      eVar32._12_4_ = 0;
      return eVar32;
    }
  } while( true );
}

Assistant:

error<idx2_err_code>
Encode(idx2_file* Idx2, const params& P, brick_copier& Copier)
{
  const int BrickBytes = Prod(Idx2->BrickDimsExt3) * sizeof(f64);
  BrickAlloc_ = free_list_allocator(BrickBytes);
  idx2_RAII(encode_data, E, Init(&E));
  idx2_BrickTraverse(
    timer Timer; StartTimer(&Timer);
    //    idx2_Assert(GetLinearBrick(*Idx2, 0, Top.BrickFrom3) == Top.Address);
    //    idx2_Assert(GetSpatialBrick(*Idx2, 0, Top.Address) == Top.BrickFrom3);
    // BVol = local brick storage (we will copy brick data from the input to this)
    brick_volume BVol;
    Resize(&BVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E.Alloc);
    Fill(idx2_Range(f64, BVol.Vol), 0.0);
    extent BrickExtent(Top.BrickFrom3 * Idx2->BrickDims3, Idx2->BrickDims3);
    // BrickExtentCrop = the true extent of the brick (boundary bricks are cropped)
    extent BrickExtentCrop = Crop(BrickExtent, extent(Idx2->Dims3));
    BVol.ExtentLocal = Relative(BrickExtentCrop, BrickExtent);
    v2d MinMax = Copier.Copy(BrickExtentCrop, BVol.ExtentLocal, &BVol);
    Idx2->ValueRange.Min = Min(Idx2->ValueRange.Min, MinMax.Min);
    Idx2->ValueRange.Max = Max(Idx2->ValueRange.Max, MinMax.Max);
    //    Copy(BrickExtentCrop, Vol, BVol.ExtentLocal, &BVol.Vol);
    E.Level = 0;
    E.Bricks3[E.Level] = Top.BrickFrom3;
    E.Brick[E.Level] = GetLinearBrick(*Idx2, E.Level, E.Bricks3[E.Level]);
    idx2_Assert(E.Brick[E.Level] == Top.Address);
    u64 BrickKey = GetBrickKey(E.Level, E.Brick[E.Level]);
    Insert(&E.BrickPool, BrickKey, BVol);
    EncodeBrick(Idx2, P, &E);
    TotalTime_ += Seconds(ElapsedTime(&Timer));
    ,
    128,
    Idx2->BricksOrder[E.Level],
    v3i(0),
    Idx2->NBricks3[E.Level],
    extent(Idx2->NBricks3[E.Level]),
    extent(Idx2->NBricks3[E.Level])
  );

  /* dump the bit streams to files */
  timer Timer;
  StartTimer(&Timer);
  idx2_PropagateIfError(FlushChunks(*Idx2, &E));
  idx2_PropagateIfError(FlushChunkExponents(*Idx2, &E));
  TotalTime_ += Seconds(ElapsedTime(&Timer));

  cstr MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  WriteMetaFile(*Idx2, P, MetaFileName);
  printf("num channels            = %" PRIi64 "\n", Size(E.Channels));
  printf("num sub channels        = %" PRIi64 "\n", Size(E.SubChannels));
  MetaFileName = idx2_PrintScratch("%s/%s/%s.idx2", P.OutDir, P.Meta.Name, P.Meta.Field);
  PrintStats(MetaFileName);
  printf("total time              = %f seconds\n", TotalTime_);
  //  _ASSERTE( _CrtCheckMemory( ) );
  return idx2_Error(idx2_err_code::NoError);
}